

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O0

void emulate_arith3(int code,reg_type *dest,reg_type *src1,reg_type *src2)

{
  reg_type *src2_local;
  reg_type *src1_local;
  reg_type *dest_local;
  int code_local;
  
  switch(code) {
  case 0:
    (dest->u).i.i = (src1->u).i.i + (src2->u).i.i;
    break;
  case 1:
    (dest->u).i.i = (src1->u).i.i + (src2->u).i.i;
    break;
  case 2:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + (long)src2->u);
    break;
  case 3:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + (long)src2->u);
    break;
  case 4:
    (dest->u).i.i = (src1->u).i.i - *(int *)&src2->u;
    break;
  case 5:
    (dest->u).i.i = (src1->u).i.i - *(int *)&src2->u;
    break;
  case 6:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - (long)src2->u);
    break;
  case 7:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - (long)src2->u);
    break;
  case 8:
    *(int *)&dest->u = *(int *)&src1->u * *(int *)&src2->u;
    break;
  case 9:
    *(int *)&dest->u = *(int *)&src1->u * *(int *)&src2->u;
    break;
  case 10:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u * (long)src2->u);
    break;
  case 0xb:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u * (long)src2->u);
    break;
  case 0xc:
    *(int *)&dest->u = *(int *)&src1->u / *(int *)&src2->u;
    break;
  case 0xd:
    *(uint *)&dest->u = *(uint *)&src1->u / *(uint *)&src2->u;
    break;
  case 0xe:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u / (ulong)src2->u);
    break;
  case 0xf:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u / (long)src2->u);
    break;
  case 0x10:
    *(int *)&dest->u = *(int *)&src1->u % *(int *)&src2->u;
    break;
  case 0x11:
    *(uint *)&dest->u = *(uint *)&src1->u % *(uint *)&src2->u;
    break;
  case 0x12:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u % (ulong)src2->u);
    break;
  case 0x13:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u % (long)src2->u);
    break;
  case 0x14:
    (dest->u).i.i = (src1->u).i.i ^ (src2->u).i.i;
    break;
  case 0x15:
    (dest->u).i.i = (src1->u).i.i ^ (src2->u).i.i;
    break;
  case 0x16:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u ^ (ulong)src2->u);
    break;
  case 0x17:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u ^ (ulong)src2->u);
    break;
  case 0x18:
    (dest->u).i.i = (src1->u).i.i & (src2->u).i.i;
    break;
  case 0x19:
    (dest->u).i.i = (src1->u).i.i & (src2->u).i.i;
    break;
  case 0x1a:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u & (ulong)src2->u);
    break;
  case 0x1b:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u & (ulong)src2->u);
    break;
  case 0x1c:
    (dest->u).i.i = (src1->u).i.i | (src2->u).i.i;
    break;
  case 0x1d:
    (dest->u).i.i = (src1->u).i.i | (src2->u).i.i;
    break;
  case 0x1e:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u | (ulong)src2->u);
    break;
  case 0x1f:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u | (ulong)src2->u);
    break;
  case 0x20:
    (dest->u).i.i = (src1->u).i.i << ((byte)(src2->u).u.u & 0x1f);
    break;
  case 0x21:
    (dest->u).i.i = (src1->u).i.i << ((byte)(src2->u).u.u & 0x1f);
    break;
  case 0x22:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << ((src2->u).c.c & 0x3fU));
    break;
  case 0x23:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u << ((src2->u).c.c & 0x3fU));
    break;
  case 0x24:
    (dest->u).i.i = (src1->u).i.i >> ((byte)(src2->u).u.u & 0x1f);
    break;
  case 0x25:
    (dest->u).i.i = (uint)(src1->u).i.i >> ((byte)(src2->u).u.u & 0x1f);
    break;
  case 0x26:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((ulong)src1->u >> ((src2->u).c.c & 0x3fU));
    break;
  case 0x27:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u >> ((src2->u).c.c & 0x3fU));
    break;
  case 0x28:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u + (long)src2->u);
    break;
  case 0x29:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((long)src1->u - (long)src2->u);
    break;
  case 0x2a:
    *(float *)&dest->u = *(float *)&src1->u + *(float *)&src2->u;
    break;
  case 0x2b:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((double)src1->u + (double)src2->u);
    break;
  case 0x2c:
    *(float *)&dest->u = *(float *)&src1->u - *(float *)&src2->u;
    break;
  case 0x2d:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((double)src1->u - (double)src2->u);
    break;
  case 0x2e:
    *(float *)&dest->u = *(float *)&src1->u * *(float *)&src2->u;
    break;
  case 0x2f:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((double)src1->u * (double)src2->u);
    break;
  case 0x30:
    *(float *)&dest->u = *(float *)&src1->u / *(float *)&src2->u;
    break;
  case 0x31:
    dest->u = (anon_union_8_11_4e3cf189_for_u)((double)src1->u / (double)src2->u);
  }
  return;
}

Assistant:

void emulate_arith3(int code, struct reg_type *dest, struct reg_type *src1, struct reg_type *src2)
{
    switch(code) {
	  case dill_jmp_addi:  dest->u.i.i =  src1->u.i.i +  src2->u.i.i; break;
	  case dill_jmp_addu:  dest->u.u.u =  src1->u.u.u +  src2->u.u.u; break;
	  case dill_jmp_addul:  dest->u.ul.ul =  src1->u.ul.ul +  src2->u.ul.ul; break;
	  case dill_jmp_addl:  dest->u.l.l =  src1->u.l.l +  src2->u.l.l; break;
	  case dill_jmp_addp:  dest->u.p.p = (char*) src1->u.p.p + (IMM_TYPE) src2->u.p.p; break;
	  case dill_jmp_subi:  dest->u.i.i =  src1->u.i.i -  src2->u.i.i; break;
	  case dill_jmp_subu:  dest->u.u.u =  src1->u.u.u -  src2->u.u.u; break;
	  case dill_jmp_subul:  dest->u.ul.ul =  src1->u.ul.ul -  src2->u.ul.ul; break;
	  case dill_jmp_subl:  dest->u.l.l =  src1->u.l.l -  src2->u.l.l; break;
	  case dill_jmp_subp:  dest->u.p.p = (char*) src1->u.p.p - (IMM_TYPE) src2->u.p.p; break;
	  case dill_jmp_mulu:  dest->u.u.u =  src1->u.u.u *  src2->u.u.u; break;
	  case dill_jmp_mulul:  dest->u.ul.ul =  src1->u.ul.ul *  src2->u.ul.ul; break;
	  case dill_jmp_muli:  dest->u.i.i =  src1->u.i.i *  src2->u.i.i; break;
	  case dill_jmp_mull:  dest->u.l.l =  src1->u.l.l *  src2->u.l.l; break;
	  case dill_jmp_divu:  dest->u.u.u =  src1->u.u.u /  src2->u.u.u; break;
	  case dill_jmp_divul:  dest->u.ul.ul =  src1->u.ul.ul /  src2->u.ul.ul; break;
	  case dill_jmp_divi:  dest->u.i.i =  src1->u.i.i /  src2->u.i.i; break;
	  case dill_jmp_divl:  dest->u.l.l =  src1->u.l.l /  src2->u.l.l; break;
	  case dill_jmp_modu:  dest->u.u.u =  src1->u.u.u %  src2->u.u.u; break;
	  case dill_jmp_modul:  dest->u.ul.ul =  src1->u.ul.ul %  src2->u.ul.ul; break;
	  case dill_jmp_modi:  dest->u.i.i =  src1->u.i.i %  src2->u.i.i; break;
	  case dill_jmp_modl:  dest->u.l.l =  src1->u.l.l %  src2->u.l.l; break;
	  case dill_jmp_andu:  dest->u.u.u =  src1->u.u.u &  src2->u.u.u; break;
	  case dill_jmp_andul:  dest->u.ul.ul =  src1->u.ul.ul &  src2->u.ul.ul; break;
	  case dill_jmp_andi:  dest->u.i.i =  src1->u.i.i &  src2->u.i.i; break;
	  case dill_jmp_andl:  dest->u.l.l =  src1->u.l.l &  src2->u.l.l; break;
	  case dill_jmp_oru:  dest->u.u.u =  src1->u.u.u |  src2->u.u.u; break;
	  case dill_jmp_orul:  dest->u.ul.ul =  src1->u.ul.ul |  src2->u.ul.ul; break;
	  case dill_jmp_ori:  dest->u.i.i =  src1->u.i.i |  src2->u.i.i; break;
	  case dill_jmp_orl:  dest->u.l.l =  src1->u.l.l |  src2->u.l.l; break;
	  case dill_jmp_xoru:  dest->u.u.u =  src1->u.u.u ^  src2->u.u.u; break;
	  case dill_jmp_xorul:  dest->u.ul.ul =  src1->u.ul.ul ^  src2->u.ul.ul; break;
	  case dill_jmp_xori:  dest->u.i.i =  src1->u.i.i ^  src2->u.i.i; break;
	  case dill_jmp_xorl:  dest->u.l.l =  src1->u.l.l ^  src2->u.l.l; break;
	  case dill_jmp_lshu:  dest->u.u.u =  src1->u.u.u <<  src2->u.u.u; break;
	  case dill_jmp_lshul:  dest->u.ul.ul =  src1->u.ul.ul <<  src2->u.ul.ul; break;
	  case dill_jmp_lshi:  dest->u.i.i =  src1->u.i.i <<  src2->u.i.i; break;
	  case dill_jmp_lshl:  dest->u.l.l =  src1->u.l.l <<  src2->u.l.l; break;
	  case dill_jmp_rshu:  dest->u.u.u =  src1->u.u.u >>  src2->u.u.u; break;
	  case dill_jmp_rshul:  dest->u.ul.ul =  src1->u.ul.ul >>  src2->u.ul.ul; break;
	  case dill_jmp_rshi:  dest->u.i.i =  src1->u.i.i >>  src2->u.i.i; break;
	  case dill_jmp_rshl:  dest->u.l.l =  src1->u.l.l >>  src2->u.l.l; break;
	  case dill_jmp_addf:  dest->u.f.f =  src1->u.f.f +  src2->u.f.f; break;
	  case dill_jmp_addd:  dest->u.d.d =  src1->u.d.d +  src2->u.d.d; break;
	  case dill_jmp_subf:  dest->u.f.f =  src1->u.f.f -  src2->u.f.f; break;
	  case dill_jmp_subd:  dest->u.d.d =  src1->u.d.d -  src2->u.d.d; break;
	  case dill_jmp_mulf:  dest->u.f.f =  src1->u.f.f *  src2->u.f.f; break;
	  case dill_jmp_muld:  dest->u.d.d =  src1->u.d.d *  src2->u.d.d; break;
	  case dill_jmp_divf:  dest->u.f.f =  src1->u.f.f /  src2->u.f.f; break;
	  case dill_jmp_divd:  dest->u.d.d =  src1->u.d.d /  src2->u.d.d; break;
    }
}